

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

UniDirectionalLSTMLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_unidirectionallstm
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x1a4) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x1a4;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.unidirectionallstm_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::UniDirectionalLSTMLayerParams>(arena);
    (this->layer_).unidirectionallstm_ = (UniDirectionalLSTMLayerParams *)LVar2;
  }
  return (UniDirectionalLSTMLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::UniDirectionalLSTMLayerParams* NeuralNetworkLayer::_internal_mutable_unidirectionallstm() {
  if (!_internal_has_unidirectionallstm()) {
    clear_layer();
    set_has_unidirectionallstm();
    layer_.unidirectionallstm_ = CreateMaybeMessage< ::CoreML::Specification::UniDirectionalLSTMLayerParams >(GetArenaForAllocation());
  }
  return layer_.unidirectionallstm_;
}